

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O2

void jinit_inverse_dct(j_decompress_ptr cinfo)

{
  jpeg_inverse_dct *pjVar1;
  void *__s;
  long lVar2;
  void **ppvVar3;
  
  pjVar1 = (jpeg_inverse_dct *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x80);
  cinfo->idct = pjVar1;
  pjVar1->start_pass = start_pass;
  ppvVar3 = &cinfo->comp_info->dct_table;
  for (lVar2 = 0; lVar2 < cinfo->num_components; lVar2 = lVar2 + 1) {
    __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
    *ppvVar3 = __s;
    memset(__s,0,0x100);
    *(undefined4 *)((long)pjVar1[1].inverse_DCT + lVar2 * 4 + -8) = 0xffffffff;
    ppvVar3 = ppvVar3 + 0xc;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_inverse_dct(j_decompress_ptr cinfo)
{
  my_idct_ptr idct;
  int ci;
  jpeg_component_info *compptr;

  idct = (my_idct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_idct_controller));
  cinfo->idct = (struct jpeg_inverse_dct *)idct;
  idct->pub.start_pass = start_pass;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Allocate and pre-zero a multiplier table for each component */
    compptr->dct_table =
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(multiplier_table));
    MEMZERO(compptr->dct_table, sizeof(multiplier_table));
    /* Mark multiplier table not yet set up for any method */
    idct->cur_method[ci] = -1;
  }
}